

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O0

void writefiles(char *path,char *s,uchar (*result) [512] [512],float sigma,int pic_t,int pic_x,
               int pic_y,int start,int end,uchar *header)

{
  FILE *__s;
  size_t sVar1;
  FILE *fd;
  int no_bytes;
  int time;
  int j;
  int i;
  char fname [100];
  int pic_y_local;
  int pic_x_local;
  int pic_t_local;
  float sigma_local;
  uchar (*result_local) [512] [512];
  char *s_local;
  char *path_local;
  
  if ((sigma != 0.0) || (NAN(sigma))) {
    fname._96_4_ = pic_y;
    printf("\nWriting smoothed files...\n");
    fd._4_4_ = -1;
    for (time = start; time <= end; time = time + 1) {
      fd._4_4_ = fd._4_4_ + 1;
      sprintf((char *)&j,"%s/smoothed.%s%d-%3.1f",(double)sigma,path,s,(ulong)(uint)time);
      __s = fopen((char *)&j,"wb");
      if (__s == (FILE *)0x0) {
        printf("File %s cannot be written\n",&j);
        exit(1);
      }
      sVar1 = fwrite(header,1,0x20,__s);
      fd._0_4_ = (uint)sVar1;
      for (no_bytes = 0; no_bytes < pic_x; no_bytes = no_bytes + 1) {
        sVar1 = fwrite(result[fd._4_4_] + no_bytes,1,(long)(int)fname._96_4_,__s);
        fd._0_4_ = (uint)fd + (int)sVar1;
      }
      printf("File %s written (%d bytes)\n",&j,(ulong)(uint)fd);
      fflush(_stdout);
      fclose(__s);
    }
  }
  return;
}

Assistant:

void writefiles(char path[], char s[],
unsigned char result[FIVE][PIC_X][PIC_Y],
float sigma,
int pic_t, int pic_x, int pic_y, int start, int end,
unsigned char header[HEAD])
{
char fname[100];
int i,j,time,no_bytes;
FILE *fd;

if(sigma==0.0) return;
printf("\nWriting smoothed files...\n");

time = -1;
for (i=start;i<=end;i++)
	{
	no_bytes = 0;
	time++;
	sprintf(fname,"%s/smoothed.%s%d-%3.1f",path,s,i,sigma);
 	if((fd=fopen(fname,"wb"))!=NULL)
		{
		no_bytes += fwrite(&header[0], sizeof(unsigned char), HEAD, fd); /* Write 32 byte raster header */
		for(j=0;j<pic_x;j++)
			no_bytes += fwrite(&result[time][j][0],sizeof(unsigned char), pic_y, fd);
		printf("File %s written (%d bytes)\n",fname,no_bytes);
		}
	else
		{
		printf("File %s cannot be written\n",fname);
		exit(1);
		}
	fflush(stdout);
	fclose(fd);
	}
}